

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformBlockTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::BlockBasicTypeCase::BlockBasicTypeCase
          (BlockBasicTypeCase *this,Context *context,char *name,char *description,VarType *type,
          deUint32 layoutFlags,int numInstances)

{
  TestContext *testCtx;
  RenderContext *renderCtx;
  UniformBlock *this_00;
  Uniform local_90;
  UniformBlock *local_40;
  UniformBlock *block;
  VarType *pVStack_30;
  deUint32 layoutFlags_local;
  VarType *type_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  BlockBasicTypeCase *this_local;
  
  block._4_4_ = layoutFlags;
  pVStack_30 = type;
  type_local = (VarType *)description;
  description_local = name;
  name_local = (char *)context;
  context_local = (Context *)this;
  testCtx = gles3::Context::getTestContext(context);
  renderCtx = gles3::Context::getRenderContext((Context *)name_local);
  deqp::gls::UniformBlockCase::UniformBlockCase
            (&this->super_UniformBlockCase,testCtx,renderCtx,description_local,(char *)type_local,
             GLSL_VERSION_300_ES,BUFFERMODE_PER_BLOCK);
  (this->super_UniformBlockCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BlockBasicTypeCase_0328fa48;
  this_00 = deqp::gls::ub::ShaderInterface::allocBlock
                      (&(this->super_UniformBlockCase).m_interface,"Block");
  local_40 = this_00;
  deqp::gls::ub::Uniform::Uniform(&local_90,"var",pVStack_30,0);
  deqp::gls::ub::UniformBlock::addUniform(this_00,&local_90);
  deqp::gls::ub::Uniform::~Uniform(&local_90);
  deqp::gls::ub::UniformBlock::setFlags(local_40,block._4_4_);
  if (0 < numInstances) {
    deqp::gls::ub::UniformBlock::setArraySize(local_40,numInstances);
    deqp::gls::ub::UniformBlock::setInstanceName(local_40,"block");
  }
  return;
}

Assistant:

BlockBasicTypeCase (Context& context, const char* name, const char* description, const VarType& type, deUint32 layoutFlags, int numInstances)
		: UniformBlockCase(context.getTestContext(), context.getRenderContext(), name, description, glu::GLSL_VERSION_300_ES, BUFFERMODE_PER_BLOCK)
	{
		UniformBlock& block = m_interface.allocBlock("Block");
		block.addUniform(Uniform("var", type, 0));
		block.setFlags(layoutFlags);

		if (numInstances > 0)
		{
			block.setArraySize(numInstances);
			block.setInstanceName("block");
		}
	}